

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::UpdateMergeFetch<int>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,
               Vector *result)

{
  uint uVar1;
  data_ptr_t __dest;
  data_ptr_t pdVar2;
  idx_t iVar3;
  ulong uVar4;
  UndoBufferPointer update_ptr;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  __dest = result->data;
  if (((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
      ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) &&
     (info->N != 0)) {
    uVar1 = info->max;
    if (info->N == 0x800) {
      switchD_012bc561::default(__dest,(void *)((long)&info[1].segment + (ulong)uVar1 * 4),0x2000);
    }
    else {
      uVar4 = 0;
      do {
        *(undefined4 *)(__dest + (ulong)*(uint *)((long)&info[1].segment + uVar4 * 4) * 4) =
             *(undefined4 *)((long)&info[1].segment + uVar4 * 4 + (ulong)uVar1 * 4);
        uVar4 = uVar4 + 1;
      } while (uVar4 < info->N);
    }
  }
  local_68.entry = (info->next).entry;
  local_68.position = (info->next).position;
  if (local_68.entry != (UndoBufferEntry *)0x0) {
    do {
      UndoBufferPointer::Pin(&local_58,&local_68);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
      iVar3 = local_58.position;
      pdVar2 = (local_58.handle.node.ptr)->buffer;
      if (((start_time < *(ulong *)(pdVar2 + local_58.position + 0x10)) &&
          (*(transaction_t *)(pdVar2 + local_58.position + 0x10) != transaction_id)) &&
         (*(int *)(pdVar2 + local_58.position + 0x20) != 0)) {
        uVar1 = *(uint *)(pdVar2 + local_58.position + 0x24);
        if (*(int *)(pdVar2 + local_58.position + 0x20) == 0x800) {
          switchD_012bc561::default
                    (__dest,pdVar2 + (ulong)uVar1 * 4 + local_58.position + 0x48,0x2000);
        }
        else {
          uVar4 = 0;
          do {
            *(undefined4 *)
             (__dest + (ulong)*(uint *)(pdVar2 + uVar4 * 4 + local_58.position + 0x48) * 4) =
                 *(undefined4 *)(pdVar2 + uVar4 * 4 + (ulong)uVar1 * 4 + local_58.position + 0x48);
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(pdVar2 + local_58.position + 0x20));
        }
      }
      local_68.entry = *(UndoBufferEntry **)(pdVar2 + iVar3 + 0x38);
      local_68.position = *(idx_t *)(pdVar2 + iVar3 + 0x40);
      BufferHandle::~BufferHandle(&local_58.handle);
    } while (local_68.entry != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

static void UpdateMergeFetch(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id,
	                                  [&](UpdateInfo &current) { MergeUpdateInfo<T>(current, result_data); });
}